

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O1

wchar_t archive_read_format_tar_cleanup(archive_read *a)

{
  archive_string *as;
  size_t *__ptr;
  
  as = (archive_string *)a->format->data;
  while (__ptr = (size_t *)as[9].length, __ptr != (size_t *)0x0) {
    as[9].length = *__ptr;
    free(__ptr);
  }
  as[9].buffer_length = 0;
  archive_string_free(as);
  archive_string_free(as + 1);
  archive_string_free(as + 2);
  archive_string_free(as + 3);
  archive_string_free(as + 4);
  archive_string_free(as + 5);
  archive_string_free((archive_string *)&as[0xb].length);
  free(as);
  a->format->data = (void *)0x0;
  return L'\0';
}

Assistant:

static int
archive_read_format_tar_cleanup(struct archive_read *a)
{
	struct tar *tar;

	tar = (struct tar *)(a->format->data);
	gnu_clear_sparse_list(tar);
	archive_string_free(&tar->entry_pathname);
	archive_string_free(&tar->entry_pathname_override);
	archive_string_free(&tar->entry_uname);
	archive_string_free(&tar->entry_gname);
	archive_string_free(&tar->entry_linkpath);
	archive_string_free(&tar->line);
	archive_string_free(&tar->localname);
	free(tar);
	(a->format->data) = NULL;
	return (ARCHIVE_OK);
}